

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

void __thiscall cppcms::rpc::json_rpc_server::check_call(json_rpc_server *this)

{
  element_type *peVar1;
  cppcms_error *this_00;
  long in_RDI;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  peVar1 = std::__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2> *)
                      (in_RDI + 0x58));
  if (peVar1 == (element_type *)0x0) {
    this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"JSON-RPC Request is not assigned to class",&local_29);
    cppcms_error::cppcms_error(this_00,in_stack_ffffffffffffffa8);
    __cxa_throw(this_00,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  return;
}

Assistant:

void json_rpc_server::check_call()
	{
		if(current_call_.get()==0)
			throw cppcms_error("JSON-RPC Request is not assigned to class");
	}